

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O2

void __thiscall pzgeom::TPZArc3D::Print(TPZArc3D *this,ostream *out)

{
  ostream *poVar1;
  
  TPZNodeRep<3,_pztopology::TPZLine>::Print(&this->super_TPZNodeRep<3,_pztopology::TPZLine>,out);
  poVar1 = std::operator<<(out,"fCenter3D ");
  poVar1 = ::operator<<(poVar1,&(this->fCenter3D).super_TPZVec<double>);
  poVar1 = std::operator<<(poVar1," finitialVector ");
  poVar1 = ::operator<<(poVar1,&(this->finitialVector).super_TPZVec<double>);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"fAngle ");
  poVar1 = std::ostream::_M_insert<double>(this->fAngle);
  std::operator<<(poVar1," fRadius ");
  poVar1 = std::ostream::_M_insert<double>(this->fRadius);
  std::operator<<(poVar1," fXcenter ");
  poVar1 = std::ostream::_M_insert<double>(this->fXcenter);
  std::operator<<(poVar1," fYcenter ");
  poVar1 = std::ostream::_M_insert<double>(this->fYcenter);
  std::endl<char,std::char_traits<char>>(poVar1);
  TPZMatrix<double>::Print((TPZMatrix<double> *)&this->fICnBase,"fICnBase",out,EFormatted);
  TPZMatrix<double>::Print((TPZMatrix<double> *)&this->fIBaseCn,"fIBaseCn",out,EFormatted);
  return;
}

Assistant:

void Print(std::ostream &out) const
		{
			pzgeom::TPZNodeRep<3,pztopology::TPZLine>::Print(out);
			out << "fCenter3D " << fCenter3D << " finitialVector " << finitialVector << std::endl;
			out << "fAngle " << fAngle << " fRadius " << fRadius << " fXcenter " << fXcenter << " fYcenter " << fYcenter << std::endl;
			fICnBase.Print("fICnBase", out);
			fIBaseCn.Print("fIBaseCn", out);
		}